

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_2::BaseTestCase::BaseTestCase
          (BaseTestCase *this,TestContext *testCtx,string *name,string *description,
          SyncPrimitive syncPrimitive,ResourceDescription *resourceDesc,OperationName writeOp,
          OperationName readOp,VkSharingMode sharingMode,PipelineCacheData *pipelineCacheData)

{
  PtrData<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  data;
  PtrData<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  data_00;
  MovePtr *pMVar1;
  OperationSupport *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  UniquePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  *this_00;
  PtrData<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  local_88;
  PtrData<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  *local_78;
  PtrData<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  local_68;
  PtrData<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  *local_58;
  ResourceDescription *local_38;
  ResourceDescription *resourceDesc_local;
  string *psStack_28;
  SyncPrimitive syncPrimitive_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  BaseTestCase *this_local;
  
  local_38 = resourceDesc;
  resourceDesc_local._4_4_ = syncPrimitive;
  psStack_28 = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseTestCase_016b2e90;
  ResourceDescription::ResourceDescription(&this->m_resourceDesc,resourceDesc);
  pMVar1 = (MovePtr *)(ulong)writeOp;
  makeOperationSupport
            ((MovePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
              *)&local_68,writeOp,resourceDesc);
  local_58 = de::details::MovePtr::operator_cast_to_PtrData(&local_68,pMVar1);
  data._8_8_ = in_stack_ffffffffffffff50;
  data.ptr = in_stack_ffffffffffffff48;
  de::details::
  UniquePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  ::UniquePtr(&this->m_writeOp,data);
  de::details::
  MovePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  ::~MovePtr((MovePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
              *)&local_68);
  this_00 = &this->m_readOp;
  pMVar1 = (MovePtr *)(ulong)readOp;
  makeOperationSupport
            ((MovePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
              *)&local_88,readOp,resourceDesc);
  local_78 = de::details::MovePtr::operator_cast_to_PtrData(&local_88,pMVar1);
  data_00._8_8_ = this_00;
  data_00.ptr = (OperationSupport *)local_78;
  de::details::
  UniquePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  ::UniquePtr(this_00,data_00);
  de::details::
  MovePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
  ::~MovePtr((MovePtr<vkt::synchronization::OperationSupport,_de::DefaultDeleter<vkt::synchronization::OperationSupport>_>
              *)&local_88);
  this->m_syncPrimitive = resourceDesc_local._4_4_;
  this->m_sharingMode = sharingMode;
  this->m_pipelineCacheData = pipelineCacheData;
  return;
}

Assistant:

BaseTestCase (tcu::TestContext&			testCtx,
				  const std::string&		name,
				  const std::string&		description,
				  const SyncPrimitive		syncPrimitive,
				  const ResourceDescription	resourceDesc,
				  const OperationName		writeOp,
				  const OperationName		readOp,
				  const VkSharingMode		sharingMode,
				  PipelineCacheData&		pipelineCacheData)
		: TestCase				(testCtx, name, description)
		, m_resourceDesc		(resourceDesc)
		, m_writeOp				(makeOperationSupport(writeOp, resourceDesc))
		, m_readOp				(makeOperationSupport(readOp, resourceDesc))
		, m_syncPrimitive		(syncPrimitive)
		, m_sharingMode			(sharingMode)
		, m_pipelineCacheData	(pipelineCacheData)
	{
	}